

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

void ws_write_cb(void *arg)

{
  nni_mtx *mtx;
  nng_err result;
  ws_frame *pwVar1;
  nni_msg *m;
  size_t count;
  nni_aio *pnVar2;
  
  mtx = (nni_mtx *)((long)arg + 0x60);
  nni_mtx_lock(mtx);
  pwVar1 = *(ws_frame **)((long)arg + 0xe8);
  if (pwVar1 == (ws_frame *)0x0) {
LAB_0012e583:
    nni_mtx_unlock(mtx);
    return;
  }
  *(undefined8 *)((long)arg + 0xe8) = 0;
  if (pwVar1->op == WS_CLOSE) {
    ws_frame_fini(pwVar1);
    while (pwVar1 = (ws_frame *)nni_list_first((nni_list *)((long)arg + 0xb8)),
          pwVar1 != (ws_frame *)0x0) {
      nni_list_remove((nni_list *)((long)arg + 0xb8),pwVar1);
      pnVar2 = pwVar1->aio;
      if (pnVar2 != (nni_aio *)0x0) {
        pwVar1->aio = (nng_aio *)0x0;
        nni_aio_list_remove(pnVar2);
        nni_aio_finish_error(pnVar2,NNG_ECLOSED);
        ws_frame_fini(pwVar1);
      }
    }
    if ((*(char *)((long)arg + 0x52) == '\x01') && (*(char *)((long)arg + 0x54) == '\x01')) {
      *(undefined1 *)((long)arg + 0x54) = 0;
      nni_aio_finish((nni_aio *)((long)arg + 0x488),NNG_OK,0);
    }
    goto LAB_0012e583;
  }
  pnVar2 = pwVar1->aio;
  result = nni_aio_result((nni_aio *)((long)arg + 0xf8));
  if (result != NNG_OK) {
    pwVar1->aio = (nng_aio *)0x0;
    if (pnVar2 != (nni_aio *)0x0) {
      nni_aio_list_remove(pnVar2);
      nni_aio_finish_error(pnVar2,result);
    }
    ws_frame_fini(pwVar1);
    *(undefined1 *)((long)arg + 0x51) = 1;
    nni_http_conn_close(*(nni_http_conn **)((long)arg + 0x9e8));
    goto LAB_0012e583;
  }
  if (pnVar2 != (nni_aio *)0x0) {
    nni_aio_iov_advance(pnVar2,pwVar1->len);
    nni_aio_bump_count(pnVar2,pwVar1->len);
    if (pwVar1->final == true) {
      pwVar1->aio = (nng_aio *)0x0;
      nni_aio_list_remove(pnVar2);
      goto LAB_0012e5dc;
    }
  }
  pnVar2 = (nni_aio *)0x0;
LAB_0012e5dc:
  if (pwVar1->final == true) {
    ws_frame_fini(pwVar1);
  }
  else {
    ws_frame_prep_tx((nni_ws *)arg,pwVar1);
    nni_list_append((nni_list *)((long)arg + 0xb8),pwVar1);
  }
  ws_start_write((nni_ws *)arg);
  nni_mtx_unlock(mtx);
  if (pnVar2 == (nni_aio *)0x0) {
    return;
  }
  m = nni_aio_get_msg(pnVar2);
  if (m != (nni_msg *)0x0) {
    nni_aio_set_msg(pnVar2,(nni_msg *)0x0);
    nni_msg_free(m);
  }
  count = nni_aio_count(pnVar2);
  nni_aio_finish_sync(pnVar2,NNG_OK,count);
  return;
}

Assistant:

static void
ws_write_cb(void *arg)
{
	nni_ws   *ws = arg;
	ws_frame *frame;
	nni_aio  *aio;
	int       rv;

	nni_mtx_lock(&ws->mtx);

	if ((frame = ws->txframe) == NULL) {
		nni_mtx_unlock(&ws->mtx);
		return;
	}
	ws->txframe = NULL;

	if (frame->op == WS_CLOSE) {
		// If this was a close frame, we are done.
		// No other messages may succeed..
		ws->txframe = NULL;
		ws_frame_fini(frame);
		while ((frame = nni_list_first(&ws->txq)) != NULL) {
			nni_list_remove(&ws->txq, frame);
			if ((aio = frame->aio) != NULL) {
				frame->aio = NULL;
				nni_aio_list_remove(aio);
				nni_aio_finish_error(aio, NNG_ECLOSED);
				ws_frame_fini(frame);
			}
		}
		if (ws->peer_closed) {
			if (ws->wclose) { // could assert this?
				ws->wclose = false;
				nni_aio_finish(&ws->closeaio, 0, 0);
			}
		}
		nni_mtx_unlock(&ws->mtx);
		return;
	}

	aio = frame->aio;
	if ((rv = nni_aio_result(&ws->txaio)) != 0) {
		// if tx fails, we can't send a close frame either
		// we expect the caller to just close this connection
		frame->aio = NULL;
		if (aio != NULL) {
			nni_aio_list_remove(aio);
			nni_aio_finish_error(aio, rv);
		}
		ws_frame_fini(frame);
		ws->closed = true;
		nni_http_conn_close(ws->http);
		nni_mtx_unlock(&ws->mtx);
		return;
	}

	if (aio != NULL) {
		nni_aio_iov_advance(aio, frame->len);
		nni_aio_bump_count(aio, frame->len);
		if (frame->final) {
			frame->aio = NULL;
			nni_aio_list_remove(aio);
		} else {
			// Clear the aio so that we won't attempt to finish
			// it outside the lock
			aio = NULL;
		}
	}

	if (frame->final) {
		ws_frame_fini(frame);
	} else {
		// This one cannot fail here, since we only do allocation
		// at initial scheduling.
		ws_frame_prep_tx(ws, frame);
		// Schedule at end.  This permits other frames to interleave.
		nni_list_append(&ws->txq, frame);
	}

	ws_start_write(ws);
	nni_mtx_unlock(&ws->mtx);

	// We attempt to finish the operation synchronously, outside the lock.
	if (aio != NULL) {
		nni_msg *msg;
		// Successful send, don't leak the message!
		if ((msg = nni_aio_get_msg(aio)) != NULL) {
			nni_aio_set_msg(aio, NULL);
			nni_msg_free(msg);
		}
		nni_aio_finish_sync(aio, 0, nni_aio_count(aio));
	}
}